

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindCommon.cxx
# Opt level: O2

void __thiscall cmFindCommon::SelectDefaultRootPathMode(cmFindCommon *this)

{
  bool bVar1;
  string *psVar2;
  RootPathMode RVar3;
  string rootPathMode;
  string findRootPathVar;
  cmAlphaNum local_40;
  
  rootPathMode._M_dataplus._M_p = &DAT_0000001a;
  rootPathMode._M_string_length = (size_type)anon_var_dwarf_162e7f5;
  local_40.View_._M_str = (this->CMakePathName)._M_dataplus._M_p;
  local_40.View_._M_len = (this->CMakePathName)._M_string_length;
  cmStrCat<>(&findRootPathVar,(cmAlphaNum *)&rootPathMode,&local_40);
  psVar2 = cmMakefile::GetSafeDefinition(this->Makefile,&findRootPathVar);
  std::__cxx11::string::string((string *)&rootPathMode,(string *)psVar2);
  bVar1 = std::operator==(&rootPathMode,"NEVER");
  RVar3 = RootPathModeNever;
  if (!bVar1) {
    bVar1 = std::operator==(&rootPathMode,"ONLY");
    if (bVar1) {
      RVar3 = RootPathModeOnly;
    }
    else {
      bVar1 = std::operator==(&rootPathMode,"BOTH");
      if (!bVar1) goto LAB_003ec17e;
      RVar3 = RootPathModeBoth;
    }
  }
  this->FindRootPathMode = RVar3;
LAB_003ec17e:
  std::__cxx11::string::~string((string *)&rootPathMode);
  std::__cxx11::string::~string((string *)&findRootPathVar);
  return;
}

Assistant:

void cmFindCommon::SelectDefaultRootPathMode()
{
  // Check the policy variable for this find command type.
  std::string findRootPathVar =
    cmStrCat("CMAKE_FIND_ROOT_PATH_MODE_", this->CMakePathName);
  std::string rootPathMode =
    this->Makefile->GetSafeDefinition(findRootPathVar);
  if (rootPathMode == "NEVER") {
    this->FindRootPathMode = RootPathModeNever;
  } else if (rootPathMode == "ONLY") {
    this->FindRootPathMode = RootPathModeOnly;
  } else if (rootPathMode == "BOTH") {
    this->FindRootPathMode = RootPathModeBoth;
  }
}